

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgDreamSampleWrapC.cpp
# Opt level: O1

void tsgGenGaussianSamples
               (int num_dimensions,int num_samples,double *mean,double *deviation,char *random_type,
               int random_seed,tsg_dream_random random_callback,double *samples)

{
  pointer pdVar1;
  int iVar2;
  time_t tVar3;
  ulong uVar4;
  vector<double,_std::allocator<double>_> result;
  minstd_rand park_miller;
  uniform_real_distribution<double> unif;
  string rtype;
  allocator_type local_12a;
  allocator_type local_129;
  _Any_data local_128;
  code *local_118;
  code *pcStack_110;
  vector<double,_std::allocator<double>_> local_108;
  vector<double,_std::allocator<double>_> local_e8;
  vector<double,_std::allocator<double>_> local_c8;
  long local_a8;
  _Any_data local_a0;
  _Manager_type local_90;
  _Any_data local_80;
  _Manager_type local_70;
  tsg_dream_random local_60;
  undefined8 local_58;
  long *local_50 [2];
  long local_40 [2];
  
  if (random_seed == -1) {
    uVar4 = time((time_t *)0x0);
  }
  else {
    uVar4 = (ulong)random_seed;
  }
  local_a8 = uVar4 % 0x7fffffff + (ulong)(uVar4 % 0x7fffffff == 0);
  local_60 = (tsg_dream_random)0x0;
  local_58 = 0x3ff0000000000000;
  if (random_seed == -1) {
    tVar3 = time((time_t *)0x0);
    random_seed = (int)tVar3;
  }
  srand(random_seed);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_50,random_type,(allocator<char> *)local_a0._M_pod_data);
  iVar2 = std::__cxx11::string::compare((char *)local_50);
  if (iVar2 == 0) {
    local_128._M_unused._M_object = (tsg_dream_random *)0x0;
    local_128._8_8_ = (long *)0x0;
    pcStack_110 = std::
                  _Function_handler<double_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:107:20)>
                  ::_M_invoke;
    local_118 = std::
                _Function_handler<double_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:107:20)>
                ::_M_manager;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)local_50);
    local_128._8_8_ = (long *)0x0;
    if (iVar2 == 0) {
      local_128._M_unused._M_object = &local_60;
      local_128._8_8_ = &local_a8;
      pcStack_110 = std::
                    _Function_handler<double_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:109:20)>
                    ::_M_invoke;
      local_118 = std::
                  _Function_handler<double_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:109:20)>
                  ::_M_manager;
    }
    else {
      local_128._M_unused._M_object = &random_callback;
      pcStack_110 = std::
                    _Function_handler<double_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:111:20)>
                    ::_M_invoke;
      local_118 = std::
                  _Function_handler<double_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:111:20)>
                  ::_M_manager;
    }
  }
  if (mean == (double *)0x0) {
    local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
  }
  else {
    std::vector<double,std::allocator<double>>::vector<double_const*,void>
              ((vector<double,std::allocator<double>> *)&local_e8,mean,mean + num_dimensions,
               &local_12a);
  }
  if (deviation == (double *)0x0) {
    local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
  }
  else {
    std::vector<double,std::allocator<double>>::vector<double_const*,void>
              ((vector<double,std::allocator<double>> *)&local_108,deviation,
               deviation + num_dimensions,&local_129);
  }
  std::function<double_()>::function
            ((function<double_()> *)&local_80,(function<double_()> *)&local_128);
  local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::function<double_()>::function
            ((function<double_()> *)&local_a0,(function<double_()> *)&local_80);
  TasDREAM::genGaussianSamples
            (&local_e8,&local_108,num_samples,&local_c8,(function<double_()> *)&local_a0);
  if (local_90 != (code *)0x0) {
    (*local_90)(&local_a0,&local_a0,__destroy_functor);
  }
  if (local_70 != (code *)0x0) {
    (*local_70)(&local_80,&local_80,__destroy_functor);
  }
  if (local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pdVar1 = local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    memmove(samples,local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
            (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start);
  }
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1,(long)local_c8.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pdVar1);
  }
  if (local_118 != (code *)0x0) {
    (*local_118)(&local_128,&local_128,__destroy_functor);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return;
}

Assistant:

void tsgGenGaussianSamples(int num_dimensions, int num_samples, double const mean[], double const deviation[],
                           const char* random_type, int random_seed, tsg_dream_random random_callback, double *samples){

    std::minstd_rand park_miller((random_seed == -1) ? static_cast<long unsigned>(std::time(nullptr)) : random_seed);
    std::uniform_real_distribution<double> unif(0.0, 1.0);
    srand((unsigned int) ((random_seed == -1) ? static_cast<long unsigned>(std::time(nullptr)) : random_seed));
    std::string rtype(random_type);

    auto randgen = [&]()->
    std::function<double(void)>{
        if (rtype == "default"){
            return [&]()->double{ return tsgCoreUniform01(); };
        }else if (rtype == "minstd_rand"){
            return [&]()->double{ return unif(park_miller); };
        }else{
            return [&]()->double{ return random_callback(); };
        }
    }();

    std::vector<double> result = TasDREAM::genGaussianSamples(Utils::copyArray(mean, num_dimensions),
                                                              Utils::copyArray(deviation, num_dimensions),
                                                              num_samples, randgen);
    std::copy(result.begin(), result.end(), samples);
}